

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta.cc
# Opt level: O1

dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *
tchecker::ta::sync_refclocks
          (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          system_t *system,reference_clock_variables_t *r,vedge_t *vedge)

{
  pointer __s;
  pointer puVar1;
  pointer psVar2;
  uint *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  bool bVar4;
  ulong uVar5;
  const_iterator_t __begin2;
  const_iterator_t __end2;
  const_iterator_t local_58;
  uint *local_40;
  
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (__return_storage_ptr__,(ulong)r->_refcount,0,(allocator<unsigned_long> *)&local_58);
  __s = (__return_storage_ptr__->m_bits).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start;
  puVar1 = (__return_storage_ptr__->m_bits).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__s != puVar1) {
    memset(__s,0,(long)puVar1 - (long)__s & 0xfffffffffffffff8);
  }
  vedge_t::begin(&local_58,vedge);
  vedge_t::end(vedge);
  if (local_58.super_type.m_iterator != local_40) {
    do {
      uVar5 = (ulong)*local_58.super_type.m_iterator;
      psVar2 = (system->super_system_t).super_system_t.super_edges_t._edges.
               super__Vector_base<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)*(pointer *)
                         ((long)&(system->super_system_t).super_system_t.super_edges_t._edges.
                                 super__Vector_base<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>
                                 ._M_impl.super__Vector_impl_data + 8) - (long)psVar2 >> 4) <= uVar5
         ) {
        __assert_fail("edge_id < _edges.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/system/edge.hh"
                      ,0x171,
                      "tchecker::system::edge_const_shared_ptr_t tchecker::system::edges_t::edge(tchecker::edge_id_t) const"
                     );
      }
      puVar3 = &(psVar2[uVar5].
                 super___shared_ptr<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _pid;
      this = psVar2[uVar5].super___shared_ptr<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      if (this == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                  (__return_storage_ptr__,
                   (ulong)(r->_procmap).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[*puVar3],true);
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this->_M_use_count = this->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this->_M_use_count = this->_M_use_count + 1;
        }
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                  (__return_storage_ptr__,
                   (ulong)(r->_procmap).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[*puVar3],true);
        if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
        }
      }
      do {
        local_58.super_type.m_iterator = local_58.super_type.m_iterator + 1;
        if (local_58.super_type.m_iterator == local_58.m_end) break;
        bVar4 = (*local_58.m_predicate)(*local_58.super_type.m_iterator);
      } while (!bVar4);
    } while (local_58.super_type.m_iterator != local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

boost::dynamic_bitset<> sync_refclocks(tchecker::ta::system_t const & system, tchecker::reference_clock_variables_t const & r,
                                       tchecker::vedge_t const & vedge)
{
  std::vector<tchecker::clock_id_t> const & procmap = r.procmap();
  boost::dynamic_bitset<> refclocks{r.refcount()};
  refclocks.reset();
  for (tchecker::edge_id_t id : vedge)
    refclocks.set(procmap[system.edge(id)->pid()]);
  return refclocks;
}